

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-optimizer.cpp
# Opt level: O2

result * baryonyx::itm::branch_optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  bool bVar1;
  _Base_ptr p_Var2;
  double local_558;
  int local_54c;
  unsigned_long local_548;
  int *local_540;
  index *local_538;
  int *local_530;
  index *local_528;
  problem_set jobs;
  result ret1;
  result ret0;
  tuple<baryonyx::problem,_baryonyx::problem> sp;
  context internal_ctx;
  
  notice<>(ctx,"- branch-optimization starts\n");
  context::context(&internal_ctx,ctx);
  internal_ctx.log_priority = warning;
  optimize(__return_storage_ptr__,&internal_ctx,pb);
  if (__return_storage_ptr__->status == success) {
    notice<double>(&internal_ctx,"  - branch optimization found solution {:f}\n",
                   &((__return_storage_ptr__->solutions).
                     super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                     _M_impl.super__Vector_impl_data._M_start)->value);
    bVar1 = __return_storage_ptr__->status == success;
  }
  else {
    bVar1 = false;
  }
  jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &jobs._M_t._M_impl.super__Rb_tree_header._M_header;
  sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
  super__Tuple_impl<1UL,_baryonyx::problem>.super__Head_base<1UL,_baryonyx::problem,_false>.
  _M_head_impl.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  jobs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (bVar1) {
    sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
    super__Tuple_impl<1UL,_baryonyx::problem>.super__Head_base<1UL,_baryonyx::problem,_false>.
    _M_head_impl.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             (__return_storage_ptr__->solutions).
             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].value;
  }
  jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>>::
  _M_emplace_equal<baryonyx::problem_const&,double,int&,int&>
            ((_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>> *)
             &jobs,pb,(double *)&sp,&__return_storage_ptr__->remaining_constraints,
             &__return_storage_ptr__->annoying_variable);
  local_54c = __return_storage_ptr__->annoying_variable;
  local_528 = &ret0.remaining_constraints;
  local_530 = &ret0.annoying_variable;
  local_538 = &ret1.remaining_constraints;
  local_540 = &ret1.annoying_variable;
  do {
    p_Var2 = jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    notice<std::basic_string_view<char,std::char_traits<char>>,int>
              (&internal_ctx,"  - branch-optimization splits on {} (id: {})\n",
               (basic_string_view<char,_std::char_traits<char>_> *)
               (&(jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left[5]._M_left)->_M_color +
               (long)*(int *)&jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left[9].field_0x4
               * 4),(int *)&jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left[9].field_0x4);
    split(&sp,&internal_ctx,(problem *)(p_Var2 + 1),local_54c);
    optimize(&ret0,&internal_ctx,
             &sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
              super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl);
    bVar1 = is_best(&internal_ctx,&ret0,__return_storage_ptr__,
                    *(objective_function_type *)&p_Var2[8]._M_left);
    if (bVar1) {
      baryonyx::result::operator=(__return_storage_ptr__,&ret0);
    }
    ret1.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if (ret0.status == success) {
      ret1.strings.super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ret0.solutions.
           super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].value;
    }
    std::_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>>::
    _M_emplace_equal<baryonyx::problem&,double,int&,int&>
              ((_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>> *)
               &jobs,&sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>.
                      super__Head_base<0UL,_baryonyx::problem,_false>._M_head_impl,(double *)&ret1,
               local_528,local_530);
    optimize(&ret1,&internal_ctx,(problem *)&sp);
    bVar1 = is_best(&internal_ctx,&ret1,__return_storage_ptr__,
                    *(objective_function_type *)&p_Var2[8]._M_left);
    if (bVar1) {
      baryonyx::result::operator=(__return_storage_ptr__,&ret1);
    }
    local_558 = 0.0;
    if (ret1.status == success) {
      local_558 = ret1.solutions.
                  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].value;
    }
    std::_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>>::
    _M_emplace_equal<baryonyx::problem&,double,int&,int&>
              ((_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>> *)
               &jobs,(problem *)&sp,&local_558,local_538,local_540);
    std::_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>>::
    erase_abi_cxx11_((_Rb_tree<node,node,std::_Identity<node>,node_result_compare,std::allocator<node>>
                      *)&jobs,(const_iterator)p_Var2);
    notice<>(&internal_ctx,"    Jobs lists:\n");
    for (p_Var2 = jobs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &jobs._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (p_Var2[9]._M_color == _S_red) {
        local_558 = (double)(*(long *)(p_Var2 + 8) - (long)p_Var2[7]._M_right);
        local_548 = ((long)p_Var2[6]._M_left - (long)p_Var2[6]._M_parent) / 0xc + (long)local_558;
        notice<double,int,unsigned_long,unsigned_long>
                  (&internal_ctx,"    * solution: {} annoying: {} vars: {}/{}\n",
                   (double *)&p_Var2[8]._M_right,(int *)&p_Var2[9].field_0x4,
                   (unsigned_long *)&local_558,&local_548);
      }
      else {
        local_558 = (double)(*(long *)(p_Var2 + 8) - (long)p_Var2[7]._M_right);
        local_548 = ((long)p_Var2[6]._M_left - (long)p_Var2[6]._M_parent) / 0xc + (long)local_558;
        notice<int,int,unsigned_long,unsigned_long>
                  (&internal_ctx,"    * remaining: {} annoying: {} vars: {}/{}\n",
                   (int *)(p_Var2 + 9),(int *)&p_Var2[9].field_0x4,(unsigned_long *)&local_558,
                   &local_548);
      }
    }
    baryonyx::result::~result(&ret1);
    baryonyx::result::~result(&ret0);
    std::_Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>::~_Tuple_impl
              (&sp.super__Tuple_impl<0UL,_baryonyx::problem,_baryonyx::problem>);
  } while (jobs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0);
  std::_Rb_tree<node,_node,_std::_Identity<node>,_node_result_compare,_std::allocator<node>_>::
  ~_Rb_tree(&jobs._M_t);
  context::~context(&internal_ctx);
  return __return_storage_ptr__;
}

Assistant:

result
branch_optimize(const baryonyx::context& ctx, const baryonyx::problem& pb)
{
    baryonyx::notice(ctx, "- branch-optimization starts\n");
    return ::optimize(ctx, pb);
}